

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t cm_get_date(time_t now,char *p)

{
  byte bVar1;
  int iVar2;
  ushort *puVar3;
  char *__s;
  char cVar4;
  int Count;
  int iVar5;
  int iVar6;
  tm *ptVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  size_t sVar10;
  size_t __n;
  ulong uVar11;
  time_t tVar12;
  time_t Future;
  time_t tVar13;
  int iVar14;
  ulong uVar15;
  ushort uVar16;
  token *ptVar17;
  token *ptVar18;
  ulong *puVar19;
  uint uVar20;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  time_t *ptVar28;
  int iVar29;
  byte *pbVar30;
  long lVar31;
  int local_111c;
  byte *local_1118;
  int local_110c;
  DSTMODE local_1108;
  ulong local_1100;
  ulong local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  time_t local_10e0;
  int local_10d4;
  ulong local_10d0;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  int local_10b8;
  int local_10b4;
  ulong local_10b0;
  time_t now_local;
  time_t local_10a0;
  time_t local_1098;
  token *local_1090;
  long local_1088;
  tm *local_1080;
  time_t local_1078 [8];
  token tokens [256];
  ulong uVar21;
  
  now_local = now;
  memset(tokens,0,0x1000);
  local_10f8 = 0;
  local_1100 = 0;
  local_10e8 = 0;
  ptVar7 = localtime(&now_local);
  if (ptVar7 == (tm *)0x0) {
    return -1;
  }
  local_10d4 = ptVar7->tm_sec;
  iVar6 = ptVar7->tm_min;
  iVar23 = ptVar7->tm_hour;
  local_10b4 = ptVar7->tm_mday;
  local_10b8 = ptVar7->tm_mon;
  iVar27 = ptVar7->tm_year;
  iVar29 = ptVar7->tm_yday;
  iVar14 = ptVar7->tm_isdst;
  local_1080 = gmtime(&now_local);
  if (local_1080 == (tm *)0x0) {
    lVar25 = 0;
  }
  else {
    iVar2 = local_1080->tm_year + 0x76b;
    iVar24 = iVar2 / 100;
    iVar5 = (iVar27 + 0x76b) / 100;
    lVar25 = ((long)local_1080->tm_sec - (long)local_10d4) +
             ((long)local_1080->tm_min - (long)iVar6) * 0x3c +
             ((long)local_1080->tm_hour - (long)iVar23) * 0xe10 +
             (long)(((iVar5 + local_1080->tm_yday) -
                    (iVar29 + (iVar27 + 0x76b >> 2) + iVar24 + (iVar5 >> 2))) +
                   (local_1080->tm_year - iVar27) * 0x16d + (iVar2 >> 2) + (iVar24 >> 2)) * 0x15180;
  }
  local_1088 = lVar25 + 0xe10;
  if (iVar14 == 0) {
    local_1088 = lVar25;
  }
  local_10c4 = iVar23;
  local_10c0 = iVar6;
  local_10bc = iVar27;
  ppuVar8 = __ctype_b_loc();
  puVar3 = *ppuVar8;
  uVar15 = 0;
  do {
    local_1090 = (token *)((long)&tokens[0].token + uVar15);
    pbVar30 = (byte *)p;
    while( true ) {
      do {
        p = (char *)pbVar30;
        uVar11 = (ulong)(byte)*p;
        uVar16 = puVar3[uVar11];
        pbVar30 = (byte *)p + 1;
      } while ((uVar16 >> 0xd & 1) != 0);
      if (*p != 0x28) break;
      iVar6 = 0;
      do {
        bVar1 = *p;
        if (bVar1 == 0x28) {
          iVar6 = iVar6 + 1;
        }
        else if (bVar1 == 0x29) {
          iVar6 = iVar6 + -1;
        }
        else if (bVar1 == 0) {
          local_1090->token = 0;
          goto LAB_003de2d1;
        }
        p = (char *)((byte *)p + 1);
        pbVar30 = (byte *)p;
      } while (0 < iVar6);
    }
    uVar21 = 0;
    local_1118 = (byte *)p;
    local_10f0 = uVar15;
    while( true ) {
      uVar20 = (uint)uVar21;
      cVar4 = (char)uVar11;
      if (cVar4 == '\0') break;
      uVar15 = uVar21;
      if ((puVar3[uVar11] & 8) == 0) {
        if ((cVar4 != '.') || (0x3e < uVar20)) break;
      }
      else {
        if (0x3e < uVar20) break;
        if (cVar4 != '.') {
          if ((puVar3[uVar11] >> 8 & 1) != 0) {
            pp_Var9 = __ctype_tolower_loc();
            cVar4 = (char)(*pp_Var9)[uVar11];
          }
          uVar15 = (ulong)(uVar20 + 1);
          *(char *)((long)local_1078 + uVar21) = cVar4;
        }
      }
      uVar11 = (ulong)local_1118[1];
      local_1118 = local_1118 + 1;
      uVar21 = uVar15;
    }
    *(undefined1 *)((long)local_1078 + uVar21) = 0;
    for (ptVar28 = &TimeWords[0].value; __s = (char *)ptVar28[-2], __s != (char *)0x0;
        ptVar28 = ptVar28 + 4) {
      sVar10 = ((LEXICON *)(ptVar28 + -3))->abbrev;
      if (sVar10 == 0) {
        sVar10 = strlen(__s);
      }
      __n = strlen((char *)local_1078);
      if ((sVar10 <= __n) && (iVar6 = strncmp(__s,(char *)local_1078,__n), iVar6 == 0)) {
        local_1090->value = *ptVar28;
        iVar6 = *(int *)(ptVar28 + -1);
        pbVar30 = local_1118;
        goto LAB_003de2ad;
      }
    }
    if ((uVar16 >> 0xb & 1) == 0) {
      iVar6 = (int)*p;
LAB_003de2ad:
      local_1090->token = iVar6;
      p = (char *)pbVar30;
      if (iVar6 == 0) {
LAB_003de2d1:
        lVar25 = 0x30;
        local_111c = 0;
        iVar27 = 0;
        local_10f0._0_4_ = 0;
        local_110c = 0;
        iVar29 = 0;
        iVar23 = 0;
        local_1118 = (byte *)0x0;
        local_10b0 = 0;
        local_10d0 = 0;
        local_10e0 = 0;
        local_1108 = DSTon;
        local_1098 = 0;
        local_10a0 = 0;
        lVar26 = 0;
        lVar22 = 0;
        ptVar18 = tokens;
        iVar6 = 0;
        tVar12 = local_1098;
        break;
      }
    }
    else {
      lVar25 = 0;
      while( true ) {
        local_1090->value = lVar25;
        bVar1 = *p;
        if ((*(byte *)((long)puVar3 + (ulong)bVar1 * 2 + 1) & 8) == 0) break;
        p = (char *)((byte *)p + 1);
        lVar25 = lVar25 * 10 + (long)(char)bVar1 + -0x30;
      }
      local_1090->token = 0x10b;
    }
    uVar15 = local_10f0 + 0x10;
    if (0xfe0 < local_10f0) {
      return -1;
    }
  } while( true );
LAB_003de358:
  local_1098 = tVar12;
  iVar14 = iVar6;
  ptVar17 = ptVar18;
  if (local_1090 <= ptVar17) {
    if (iVar29 == 0) {
      local_1108 = DSTmaybe;
      local_1118 = (byte *)local_1088;
    }
    else if (local_1080 != (tm *)0x0) {
      now_local = now_local - (long)local_1118;
      ptVar7 = gmtime(&now_local);
      if (ptVar7 != (tm *)0x0) {
        local_10d4 = ptVar7->tm_sec;
        local_10c0 = ptVar7->tm_min;
        local_10c4 = ptVar7->tm_hour;
        local_10b4 = ptVar7->tm_mday;
        local_10b8 = ptVar7->tm_mon;
        local_10bc = ptVar7->tm_year;
      }
      now_local = now_local + (long)local_1118;
    }
    iVar6 = (int)local_10f0;
    if (local_111c == 0) {
      local_10e8 = (ulong)(local_10bc + 0x76c);
    }
    if (iVar27 == 0) {
      local_1100 = (ulong)(local_10b8 + 1);
    }
    if ((int)local_10f0 == 0) {
      local_10f8 = (ulong)local_10b4;
    }
    if (((int)local_10f0 < 2 && iVar27 < 2) &&
        ((local_111c < 2 && iVar14 < 2) && (iVar29 < 2 && local_110c < 2))) {
      local_10f0 = CONCAT44(local_10f0._4_4_,iVar14);
      if ((((iVar27 == 0 && local_111c == 0) && iVar6 == 0) && iVar14 == 0) && local_110c == 0) {
        tVar12 = now_local;
        if (iVar23 == 0) {
          tVar12 = now_local +
                   (long)local_10c4 * -0xe10 + ((long)local_10c0 * -0x3c - (long)local_10d4);
        }
      }
      else {
        tVar12 = Convert(local_1100,local_10f8,local_10e8,local_10b0,local_10d0,local_10e0,
                         (time_t)local_1118,local_1108);
        if (tVar12 < 0) {
          return -1;
        }
      }
      if (lVar26 == 0) {
        tVar13 = 0;
      }
      else {
        local_1078[0] = tVar12 + lVar22;
        ptVar7 = localtime(local_1078);
        tVar13 = local_1078[0];
        lVar25 = lVar26 + ptVar7->tm_mon + (long)(ptVar7->tm_year * 0xc + 0x5910);
        Future = Convert(lVar25 % 0xc + 1,(long)ptVar7->tm_mday,lVar25 / 0xc,(long)ptVar7->tm_hour,
                         (long)ptVar7->tm_min,(long)ptVar7->tm_sec,(time_t)local_1118,DSTmaybe);
        tVar13 = DSTcorrect(tVar13,Future);
      }
      lVar25 = tVar13 + tVar12 + lVar22;
      if (((int)local_10f0 != 0) && ((iVar27 == 0 && local_111c == 0) && iVar6 == 0)) {
        local_1078[0] = lVar25 - (long)local_1118;
        ptVar7 = gmtime(local_1078);
        lVar22 = (local_1098 - (ulong)(0 < local_1098)) * 0x93a80 + lVar25 +
                 (((local_10a0 - ptVar7->tm_wday) + 7) % 7) * 0x15180;
        if (local_1108 == DSTmaybe) {
          lVar22 = DSTcorrect(lVar25,lVar22);
        }
        else {
          lVar22 = lVar22 - lVar25;
        }
        lVar25 = lVar25 + lVar22;
      }
      tVar12 = 0;
      if (lVar25 != -1) {
        tVar12 = lVar25;
      }
    }
    else {
switchD_003de378_caseD_107:
      tVar12 = -1;
    }
    return tVar12;
  }
  iVar2 = ptVar17->token;
  lVar31 = 0x10;
  iVar6 = iVar14;
  tVar12 = local_1098;
  switch(iVar2) {
  case 0x105:
    local_10a0 = ptVar17->value;
    local_1098 = 1;
    ptVar18 = ptVar17 + 1;
    iVar6 = iVar14 + 1;
    tVar12 = 1;
    if (ptVar17[1].token == 0x2c) {
LAB_003de39e:
      ptVar18 = ptVar17 + 2;
      iVar6 = iVar14 + 1;
      tVar12 = local_1098;
    }
    goto LAB_003de358;
  case 0x106:
    iVar29 = iVar29 + 1;
    local_1118 = (byte *)ptVar17->value;
    local_1108 = DSTon;
    ptVar18 = ptVar17 + 1;
    goto LAB_003de358;
  case 0x107:
    goto switchD_003de378_caseD_107;
  case 0x108:
    if (ptVar17[1].token != 0x10b) goto switchD_003de378_caseD_107;
    if ((ptVar17[2].token == 0x2c) && (ptVar17[3].token == 0x10b)) {
      local_111c = local_111c + 1;
      local_1100 = ptVar17->value;
      local_10f8 = ptVar17[1].value;
      uVar15 = ptVar17[3].value;
      puVar19 = &local_10e8;
      lVar31 = 0x40;
    }
    else {
      local_1100 = ptVar17->value;
      uVar15 = ptVar17[1].value;
      puVar19 = &local_10f8;
LAB_003de517:
      lVar31 = 0x20;
    }
LAB_003de51b:
    local_10f0._0_4_ = (int)local_10f0 + 1;
    iVar27 = iVar27 + 1;
    *puVar19 = uVar15;
    ptVar18 = (token *)((long)&ptVar17->token + lVar31);
    goto LAB_003de358;
  case 0x109:
    lVar26 = lVar26 + ptVar17->value;
    break;
  case 0x10a:
    lVar22 = lVar22 + ptVar17->value;
    break;
  case 0x10b:
    ptVar18 = ptVar17 + 1;
    iVar2 = ptVar17[1].token;
    lVar31 = lVar25;
    switch(iVar2) {
    case 0x105:
      local_1098 = ptVar17->value;
      local_10a0 = ptVar17[1].value;
      goto LAB_003de39e;
    case 0x107:
      goto switchD_003de416_caseD_107;
    case 0x108:
      if (ptVar17[2].token != 0x10b) {
        local_10f8 = ptVar17->value;
        uVar15 = ptVar17[1].value;
        puVar19 = &local_1100;
        goto LAB_003de517;
      }
      local_111c = local_111c + 1;
      local_10f8 = ptVar17->value;
      local_1100 = ptVar17[1].value;
      uVar15 = ptVar17[2].value;
      puVar19 = &local_10e8;
      goto LAB_003de51b;
    case 0x109:
      lVar26 = lVar26 + ptVar17[1].value * ptVar17->value;
      goto LAB_003de6d4;
    case 0x10a:
      lVar22 = lVar22 + ptVar17[1].value * ptVar17->value;
LAB_003de6d4:
      lVar31 = 0x20;
      break;
    default:
      if (iVar2 == 0x2d) {
        if (ptVar17[2].token == 0x108) {
          if ((ptVar17[3].token == 0x2d) && (ptVar17[4].token == 0x10b)) {
            uVar11 = ptVar17->value;
            local_1100 = ptVar17[2].value;
            uVar15 = uVar11;
            local_10e8 = ptVar17[4].value;
            if (0x1f < (long)uVar11) {
              uVar15 = ptVar17[4].value;
              local_10e8 = uVar11;
            }
            goto LAB_003de80c;
          }
        }
        else if (((ptVar17[2].token == 0x10b) && (ptVar17[3].token == 0x2d)) &&
                (ptVar17[4].token == 0x10b)) {
          uVar15 = ptVar17->value;
LAB_003de78e:
          local_10e8 = uVar15;
          local_1100 = ptVar17[2].value;
          uVar15 = ptVar17[4].value;
LAB_003de80c:
          puVar19 = &local_10f8;
          goto LAB_003de943;
        }
      }
      else if (iVar2 == 0x2f) {
        if (ptVar17[2].token == 0x10b) {
          if ((ptVar17[3].token != 0x2f) || (ptVar17[4].token != 0x10b)) {
            local_1100 = ptVar17->value;
            uVar15 = ptVar17[2].value;
            puVar19 = &local_10f8;
            goto LAB_003de51b;
          }
          local_1100 = ptVar17->value;
          uVar15 = local_1100;
          if (0xc < (long)local_1100) goto LAB_003de78e;
          local_10f8 = ptVar17[2].value;
          uVar15 = ptVar17[4].value;
          puVar19 = &local_10e8;
LAB_003de943:
          local_111c = local_111c + 1;
          lVar31 = 0x50;
          goto LAB_003de51b;
        }
      }
      else if ((iVar2 == 0x3a) && (ptVar17[2].token == 0x10b)) {
        ptVar18 = ptVar17 + 3;
        iVar14 = ptVar17[3].token;
        if (iVar14 == 0x3a) {
          if (ptVar17[4].token == 0x10b) {
            local_10e0 = ptVar17[4].value;
            ptVar18 = ptVar17 + 5;
            iVar14 = ptVar17[5].token;
          }
          else {
            local_10e0 = 0;
            iVar14 = 0x3a;
          }
        }
        else {
          local_10e0 = 0;
        }
        local_10b0 = ptVar17->value;
        local_10d0 = ptVar17[2].value;
        if (iVar14 == 0x107) goto LAB_003de602;
        goto LAB_003de62a;
      }
    case 0x106:
      uVar15 = ptVar17->value;
      if ((local_111c == 0 && iVar23 == 0) && local_110c != 0) {
        local_111c = 1;
        iVar23 = 0;
        local_10e8 = uVar15;
      }
      else if ((long)uVar15 < 0x2711) {
        if ((long)uVar15 < 0x18) {
          local_110c = local_110c + 1;
          local_10d0 = 0;
          local_10b0 = uVar15;
        }
        else {
          uVar16 = (ushort)uVar15 % 100;
          if ((0x95f < uVar15) || (0x3b < uVar16)) goto switchD_003de378_caseD_107;
          local_10b0 = (ulong)(ushort)((ushort)uVar15 / 100);
          local_10d0 = (ulong)uVar16;
        }
        local_10e0 = 0;
      }
      else {
        local_10f8 = uVar15 % 100;
        local_111c = local_111c + 1;
        iVar27 = iVar27 + 1;
        local_10f0._0_4_ = (int)local_10f0 + 1;
        local_1100 = (uVar15 / 100) % 100;
        local_10e8 = uVar15 / 10000;
      }
      goto LAB_003de358;
    }
  case 0x10c:
    goto switchD_003de378_caseD_10c;
  default:
    lVar31 = lVar25;
    if (iVar2 == 0x2b) {
      if (ptVar17[1].token != 0x10b) goto switchD_003de378_caseD_107;
      if (ptVar17[2].token == 0x109) {
        lVar26 = lVar26 + ptVar17[2].value * ptVar17[1].value;
      }
      else {
        if (ptVar17[2].token != 0x10a) goto switchD_003de378_caseD_107;
        lVar22 = lVar22 + ptVar17[2].value * ptVar17[1].value;
      }
    }
    else {
      if ((iVar2 != 0x2d) || (ptVar17[1].token != 0x10b)) goto switchD_003de378_caseD_107;
      if (ptVar17[2].token == 0x109) {
        lVar26 = lVar26 - ptVar17[2].value * ptVar17[1].value;
      }
      else {
        if (ptVar17[2].token != 0x10a) goto switchD_003de378_caseD_107;
        lVar22 = lVar22 - ptVar17[2].value * ptVar17[1].value;
      }
    }
  }
  iVar23 = iVar23 + 1;
  ptVar18 = (token *)((long)&ptVar17->token + lVar31);
  if (*(int *)((long)&ptVar17->token + lVar31) == 0x104) {
    lVar22 = -lVar22;
    lVar26 = -lVar26;
    ptVar18 = ptVar18 + 1;
  }
  goto LAB_003de358;
switchD_003de378_caseD_10c:
  local_1108 = (DSTMODE)(ptVar17[1].token != 0x10d);
  iVar29 = iVar29 + 1;
  local_1118 = (byte *)ptVar17->value;
  ptVar18 = ptVar17 + 1;
  goto LAB_003de358;
switchD_003de416_caseD_107:
  local_10b0 = ptVar17->value;
  local_10d0 = 0;
  local_10e0 = 0;
LAB_003de602:
  uVar11 = local_10b0 + 0xc;
  uVar15 = local_10b0;
  if (local_10b0 == 0xc) {
    uVar11 = local_10b0;
    uVar15 = 0;
  }
  local_10b0 = uVar11;
  if (ptVar18->value != 1) {
    local_10b0 = uVar15;
  }
  iVar14 = ptVar18[1].token;
  ptVar18 = ptVar18 + 1;
LAB_003de62a:
  local_110c = local_110c + 1;
  if (iVar14 == 0x2b) {
    if (ptVar18[1].token != 0x10b) goto LAB_003de358;
    iVar29 = iVar29 + 1;
    local_1118 = (byte *)((ptVar18[1].value % 100) * -0x3c + (ptVar18[1].value / 100) * -0xe10);
    iVar14 = ptVar18[2].token;
    ptVar18 = ptVar18 + 2;
    local_1108 = DSToff;
  }
  if ((iVar14 == 0x2d) && (ptVar18[1].token == 0x10b)) {
    iVar29 = iVar29 + 1;
    local_1118 = (byte *)((ptVar18[1].value % 100) * 0x3c + (ptVar18[1].value / 100) * 0xe10);
    local_1108 = DSToff;
    ptVar18 = ptVar18 + 2;
  }
  goto LAB_003de358;
}

Assistant:

time_t
__archive_get_date(time_t now, const char *p)
{
	struct token	tokens[256];
	struct gdstate	_gds;
	struct token	*lasttoken;
	struct gdstate	*gds;
	struct tm	local, *tm;
	struct tm	gmt, *gmt_ptr;
	time_t		Start;
	time_t		tod;
	long		tzone;
#if defined(HAVE__LOCALTIME64_S) || defined(HAVE__GMTIME64_S)
	errno_t		terr;
	__time64_t	tmptime;
#endif

	/* Clear out the parsed token array. */
	memset(tokens, 0, sizeof(tokens));
	/* Initialize the parser state. */
	memset(&_gds, 0, sizeof(_gds));
	gds = &_gds;

	/* Look up the current time. */
#if defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&now, &local);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = now;
	terr = _localtime64_s(&local, &tmptime);
	if (terr)
		tm = NULL;
	else
		tm = &local;
#else
	memset(&local, 0, sizeof(local));
	tm = localtime(&now);
#endif
	if (tm == NULL)
		return -1;
#if !defined(HAVE_LOCALTIME_R) && !defined(HAVE__LOCALTIME64_S)
	local = *tm;
#endif

	/* Look up UTC if we can and use that to determine the current
	 * timezone offset. */
#if defined(HAVE_GMTIME_R)
	gmt_ptr = gmtime_r(&now, &gmt);
#elif defined(HAVE__GMTIME64_S)
	tmptime = now;
	terr = _gmtime64_s(&gmt, &tmptime);
	if (terr)
		gmt_ptr = NULL;
	else
		gmt_ptr = &gmt;
#else
	memset(&gmt, 0, sizeof(gmt));
	gmt_ptr = gmtime(&now);
	if (gmt_ptr != NULL) {
		/* Copy, in case localtime and gmtime use the same buffer. */
		gmt = *gmt_ptr;
	}
#endif
	if (gmt_ptr != NULL)
		tzone = difftm (&gmt, &local);
	else
		/* This system doesn't understand timezones; fake it. */
		tzone = 0;
	if(local.tm_isdst)
		tzone += HOUR;

	/* Tokenize the input string. */
	lasttoken = tokens;
	while ((lasttoken->token = nexttoken(&p, &lasttoken->value)) != 0) {
		++lasttoken;
		if (lasttoken > tokens + 255)
			return -1;
	}
	gds->tokenp = tokens;

	/* Match phrases until we run out of input tokens. */
	while (gds->tokenp < lasttoken) {
		if (!phrase(gds))
			return -1;
	}

	/* Use current local timezone if none was specified. */
	if (!gds->HaveZone) {
		gds->Timezone = tzone;
		gds->DSTmode = DSTmaybe;
	}

	/* If a timezone was specified, use that for generating the default
	 * time components instead of the local timezone. */
	if (gds->HaveZone && gmt_ptr != NULL) {
		now -= gds->Timezone;
#if defined(HAVE_GMTIME_R)
		gmt_ptr = gmtime_r(&now, &gmt);
#elif defined(HAVE__GMTIME64_S)
		tmptime = now;
		terr = _gmtime64_s(&gmt, &tmptime);
		if (terr)
			gmt_ptr = NULL;
		else
			gmt_ptr = &gmt;
#else
		gmt_ptr = gmtime(&now);
#endif
		if (gmt_ptr != NULL)
			local = *gmt_ptr;
		now += gds->Timezone;
	}

	if (!gds->HaveYear)
		gds->Year = local.tm_year + 1900;
	if (!gds->HaveMonth)
		gds->Month = local.tm_mon + 1;
	if (!gds->HaveDay)
		gds->Day = local.tm_mday;
	/* Note: No default for hour/min/sec; a specifier that just
	 * gives date always refers to 00:00 on that date. */

	/* If we saw more than one time, timezone, weekday, year, month,
	 * or day, then give up. */
	if (gds->HaveTime > 1 || gds->HaveZone > 1 || gds->HaveWeekDay > 1
	    || gds->HaveYear > 1 || gds->HaveMonth > 1 || gds->HaveDay > 1)
		return -1;

	/* Compute an absolute time based on whatever absolute information
	 * we collected. */
	if (gds->HaveYear || gds->HaveMonth || gds->HaveDay
	    || gds->HaveTime || gds->HaveWeekDay) {
		Start = Convert(gds->Month, gds->Day, gds->Year,
		    gds->Hour, gds->Minutes, gds->Seconds,
		    gds->Timezone, gds->DSTmode);
		if (Start < 0)
			return -1;
	} else {
		Start = now;
		if (!gds->HaveRel)
			Start -= local.tm_hour * HOUR + local.tm_min * MINUTE
			    + local.tm_sec;
	}

	/* Add the relative offset. */
	Start += gds->RelSeconds;
	Start += RelativeMonth(Start, gds->Timezone, gds->RelMonth);

	/* Adjust for day-of-week offsets. */
	if (gds->HaveWeekDay
	    && !(gds->HaveYear || gds->HaveMonth || gds->HaveDay)) {
		tod = RelativeDate(Start, gds->Timezone,
		    gds->DSTmode, gds->DayOrdinal, gds->DayNumber);
		Start += tod;
	}

	/* -1 is an error indicator, so return 0 instead of -1 if
	 * that's the actual time. */
	return Start == -1 ? 0 : Start;
}